

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrome_trace_converter.cpp
# Opt level: O0

void __thiscall
HawkTracer::client::ChromeTraceConverter::process_event(ChromeTraceConverter *this,Event *event)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  HT_TimestampNs nano_secs;
  uint64_t uVar4;
  unsigned_long nano_secs_00;
  undefined1 local_c0 [40];
  string local_98 [32];
  unsigned_long local_78;
  allocator local_69;
  string local_68 [32];
  undefined4 local_48;
  undefined1 local_38 [8];
  string label;
  Event *event_local;
  ChromeTraceConverter *this_local;
  
  Converter::_get_label_abi_cxx11_((Converter *)local_38,(Event *)this);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"");
  if (bVar1) {
    local_48 = 1;
  }
  else {
    if ((this->_first_event_saved & 1U) == 0) {
      this->_first_event_saved = true;
    }
    else {
      std::operator<<((ostream *)&this->_file,",");
    }
    poVar3 = std::operator<<((ostream *)&this->_file,"{\"name\": \"");
    poVar3 = std::operator<<(poVar3,(string *)local_38);
    poVar3 = std::operator<<(poVar3,"\", \"ph\": \"X\", \"ts\": ");
    nano_secs = parser::Event::get_timestamp(event);
    uVar4 = ns_to_ms(nano_secs);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    poVar3 = std::operator<<(poVar3,", \"dur\": ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"duration",&local_69);
    local_78 = 0;
    nano_secs_00 = parser::Event::get_value_or_default<unsigned_long>
                             (event,(string *)local_68,&local_78);
    uVar4 = ns_to_ms(nano_secs_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    poVar3 = std::operator<<(poVar3,", \"pid\": 0, \"tid\": ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"thread_id",(allocator *)(local_c0 + 0x27));
    local_c0._32_4_ = 0;
    uVar2 = parser::Event::get_value_or_default<unsigned_int>
                      (event,(string *)local_98,(uint *)(local_c0 + 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    poVar3 = std::operator<<(poVar3,", \"args\": {");
    _get_args_abi_cxx11_((ChromeTraceConverter *)local_c0,event);
    poVar3 = std::operator<<(poVar3,(string *)local_c0);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,"}");
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x27));
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_48 = 0;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ChromeTraceConverter::process_event(const parser::Event& event)
{
    std::string label = _get_label(event);

    if (label == "")
    {
        return;
    }

    if (_first_event_saved)
    {
        _file << ",";
    }
    else
    {
        _first_event_saved = true;
    }

    // Chrome expects the timestamps/durations to be microseconds
    // so we need to convert from nano to micro
    _file << "{\"name\": \"" << label
         << "\", \"ph\": \"X\", \"ts\": " << ns_to_ms(event.get_timestamp())
         << ", \"dur\": " << ns_to_ms(event.get_value_or_default<HT_DurationNs>("duration", 0u))
         << ", \"pid\": 0, \"tid\": " << event.get_value_or_default<HT_ThreadId>("thread_id", 0u)
         << ", \"args\": {" << _get_args(event) << "}"
         << "}";
}